

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QItemViewPaintPair>::emplace<QItemViewPaintPair>
          (QMovableArrayOps<QItemViewPaintPair> *this,qsizetype i,QItemViewPaintPair *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  QItemViewPaintPair *pQVar4;
  Inserter *in_RDX;
  QItemViewPaintPair *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QItemViewPaintPair tmp;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  byte bVar7;
  Inserter *this_00;
  Inserter local_58;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QItemViewPaintPair>::needsDetach
                    ((QArrayDataPointer<QItemViewPaintPair> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QItemViewPaintPair>::freeSpaceAtEnd
                          ((QArrayDataPointer<QItemViewPaintPair> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT24(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QItemViewPaintPair>::end
                         ((QArrayDataPointer<QItemViewPaintPair> *)in_RDI);
      memcpy(pQVar4,in_RDX,0x28);
      in_RDI->displaceTo = (QItemViewPaintPair *)((long)&(in_RDI->displaceTo->rect).x1.m_i + 1);
      goto LAB_0082bc42;
    }
    if ((in_RSI == (QItemViewPaintPair *)0x0) &&
       (qVar3 = QArrayDataPointer<QItemViewPaintPair>::freeSpaceAtBegin
                          ((QArrayDataPointer<QItemViewPaintPair> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT24(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QItemViewPaintPair>::begin
                         ((QArrayDataPointer<QItemViewPaintPair> *)0x82bb0f);
      memcpy(pQVar4 + -1,in_RDX,0x28);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QItemViewPaintPair *)((long)&(in_RDI->displaceTo->rect).x1.m_i + 1);
      goto LAB_0082bc42;
    }
  }
  memset(local_30,0xaa,0x28);
  memcpy(local_30,in_RDX,0x28);
  bVar5 = in_RDI->displaceTo != (QItemViewPaintPair *)0x0;
  uVar6 = bVar5 && in_RSI == (QItemViewPaintPair *)0x0;
  uVar2 = (uint)(bVar5 && in_RSI == (QItemViewPaintPair *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QItemViewPaintPair>::detachAndGrow
            ((QArrayDataPointer<QItemViewPaintPair> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QItemViewPaintPair **)
             CONCAT17(uVar1,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff8c,uVar2))),
             (QArrayDataPointer<QItemViewPaintPair> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QItemViewPaintPair> *)
                              CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffff8c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff78));
    Inserter::insertOne(in_RDI,(QItemViewPaintPair *)CONCAT17(uVar6,in_stack_ffffffffffffff78));
    Inserter::~Inserter(&local_58);
  }
  else {
    pQVar4 = QArrayDataPointer<QItemViewPaintPair>::begin
                       ((QArrayDataPointer<QItemViewPaintPair> *)0x82bbdb);
    memcpy(pQVar4 + -1,local_30,0x28);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QItemViewPaintPair *)((long)&(in_RDI->displaceTo->rect).x1.m_i + 1);
  }
LAB_0082bc42:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }